

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

ItemSimilarityRecommender_ConnectedItem *
google::protobuf::internal::
GenericTypeHandler<CoreML::Specification::ItemSimilarityRecommender_ConnectedItem>::New
          (Arena *arena)

{
  Arena *arena_local;
  ItemSimilarityRecommender_ConnectedItem *local_28;
  ItemSimilarityRecommender_ConnectedItem *t;
  
  if (arena == (Arena *)0x0) {
    local_28 = (ItemSimilarityRecommender_ConnectedItem *)operator_new(0x28);
    CoreML::Specification::ItemSimilarityRecommender_ConnectedItem::
    ItemSimilarityRecommender_ConnectedItem(local_28);
  }
  else {
    local_28 = (ItemSimilarityRecommender_ConnectedItem *)
               Arena::AllocateAligned
                         (arena,(type_info *)
                                &CoreML::Specification::ItemSimilarityRecommender_ConnectedItem::
                                 typeinfo,0x28);
    CoreML::Specification::ItemSimilarityRecommender_ConnectedItem::
    ItemSimilarityRecommender_ConnectedItem(local_28);
    Arena::AddListNode(arena,local_28,
                       arena_destruct_object<CoreML::Specification::ItemSimilarityRecommender_ConnectedItem>
                      );
  }
  return local_28;
}

Assistant:

static inline GenericType* New(Arena* arena) {
    return ::google::protobuf::Arena::CreateMaybeMessage<Type>(
        arena, static_cast<GenericType*>(0));
  }